

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

LIBSSH2_CHANNEL *
libssh2_channel_direct_streamlocal_ex
          (LIBSSH2_SESSION *session,char *socket_path,char *shost,int sport)

{
  int iVar1;
  time_t start_time;
  size_t sVar2;
  size_t sVar3;
  LIBSSH2_CHANNEL *pLVar4;
  size_t sVar5;
  uchar *local_38;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    start_time = time((time_t *)0x0);
    do {
      if (session->direct_state == libssh2_NB_state_idle) {
        sVar2 = strlen(socket_path);
        session->direct_host_len = sVar2;
        sVar3 = strlen(shost);
        session->direct_shost_len = sVar3;
        sVar5 = sVar2 + sVar3 + 0xc;
        session->direct_message_len = sVar5;
        local_38 = (uchar *)(*session->alloc)(sVar5,&session->abstract);
        session->direct_message = local_38;
        if (local_38 != (uchar *)0x0) {
          _libssh2_store_str(&local_38,socket_path,session->direct_host_len);
          _libssh2_store_str(&local_38,shost,session->direct_shost_len);
          _libssh2_store_u32(&local_38,sport);
          goto LAB_0011e77a;
        }
        _libssh2_error(session,-6,"Unable to allocate memory for direct-streamlocal connection");
LAB_0011e803:
        pLVar4 = (LIBSSH2_CHANNEL *)0x0;
      }
      else {
LAB_0011e77a:
        pLVar4 = _libssh2_channel_open
                           (session,"direct-streamlocal@openssh.com",0x1e,0x200000,0x8000,
                            session->direct_message,session->direct_message_len);
        if ((pLVar4 == (LIBSSH2_CHANNEL *)0x0) &&
           (iVar1 = libssh2_session_last_errno(session), iVar1 == -0x25)) {
          session->direct_state = libssh2_NB_state_created;
          goto LAB_0011e803;
        }
        session->direct_state = libssh2_NB_state_idle;
        (*session->free)(session->direct_message,&session->abstract);
        session->direct_message = (uchar *)0x0;
      }
      if (pLVar4 != (LIBSSH2_CHANNEL *)0x0) {
        return pLVar4;
      }
      if (session->api_block_mode == 0) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
      iVar1 = libssh2_session_last_errno(session);
    } while ((iVar1 == -0x25) && (iVar1 = _libssh2_wait_socket(session,start_time), iVar1 == 0));
  }
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

LIBSSH2_API LIBSSH2_CHANNEL *
libssh2_channel_direct_streamlocal_ex(LIBSSH2_SESSION * session,
                                      const char *socket_path,
                                      const char *shost, int sport)
{
    LIBSSH2_CHANNEL *ptr;

    if(!session)
        return NULL;

    BLOCK_ADJUST_ERRNO(ptr, session,
                       channel_direct_streamlocal(session,
                       socket_path, shost, sport));
    return ptr;
}